

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_aead_common.c
# Opt level: O1

void ascon_aead_generate_tag(ascon_aead_ctx_t *ctx,uint8_t *tag,size_t tag_len)

{
  ulong uVar1;
  
  if (0x10 < tag_len) {
    do {
      bigendian_encode_u64(tag,(ctx->bufstate).sponge.x3);
      bigendian_encode_u64(tag + 8,(ctx->bufstate).sponge.x4);
      ascon_permutation_12((ascon_sponge_t *)ctx);
      tag_len = tag_len - 0x10;
      tag = tag + 0x10;
    } while (0x10 < tag_len);
  }
  uVar1 = 8;
  if (tag_len < 8) {
    uVar1 = tag_len;
  }
  bigendian_encode_varlen(tag,(ctx->bufstate).sponge.x3,(uint_fast8_t)uVar1);
  bigendian_encode_varlen(tag + uVar1,(ctx->bufstate).sponge.x4,(char)tag_len - (uint_fast8_t)uVar1)
  ;
  return;
}

Assistant:

void
ascon_aead_generate_tag(ascon_aead_ctx_t* const ctx,
                        uint8_t* tag,
                        size_t tag_len)
{
    while (tag_len > ASCON_AEAD_TAG_MIN_SECURE_LEN)
    {
        // All bytes before the last 16
        // Note: converting the sponge uint64_t to bytes to then check them as
        // uint64_t is required, as the conversion to bytes ensures the
        // proper byte order regardless of the platform native endianness.
        bigendian_encode_u64(tag, ctx->bufstate.sponge.x3);
        bigendian_encode_u64(tag + sizeof(uint64_t), ctx->bufstate.sponge.x4);
        ascon_permutation_12(&ctx->bufstate.sponge);
        tag_len -= ASCON_AEAD_TAG_MIN_SECURE_LEN;
        tag += ASCON_AEAD_TAG_MIN_SECURE_LEN;
    }
    // The last 16 or fewer bytes (also 0)
    uint_fast8_t remaining = (uint_fast8_t) MIN(sizeof(uint64_t), tag_len);
    bigendian_encode_varlen(tag, ctx->bufstate.sponge.x3, remaining);
    tag += remaining;
    // The last 8 or fewer bytes (also 0)
    tag_len -= remaining;
    bigendian_encode_varlen(tag, ctx->bufstate.sponge.x4, (uint_fast8_t) tag_len);
}